

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

int rsg::countSamplers(VariableManager *varManager,Type samplerType)

{
  pointer ppVVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Var4;
  IsSamplerEntry local_4c;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsSamplerEntry> local_48;
  
  VariableManager::getBegin<rsg::(anonymous_namespace)::IsSamplerEntry>
            (&local_48,varManager,(IsSamplerEntry)samplerType);
  ppVVar1 = (varManager->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
      .m_iter._M_current == ppVVar1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    _Var4._M_current =
         local_48.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_iter._M_current;
    do {
      iVar3 = iVar3 + 1;
      local_4c.m_type =
           local_48.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
           .m_filter.m_type;
      do {
        _Var4._M_current = _Var4._M_current + 1;
        if (_Var4._M_current ==
            local_48.
            super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
            .m_end._M_current) break;
        bVar2 = anon_unknown_0::IsSamplerEntry::operator()(&local_4c,*_Var4._M_current);
      } while (!bVar2);
    } while (_Var4._M_current != ppVVar1);
  }
  return iVar3;
}

Assistant:

static int countSamplers (const VariableManager& varManager, VariableType::Type samplerType)
{
	int numSamplers = 0;

	IsSamplerEntry::Iterator	i		= varManager.getBegin(IsSamplerEntry(samplerType));
	IsSamplerEntry::Iterator	end		= varManager.getEnd(IsSamplerEntry(samplerType));

	for (; i != end; i++)
		numSamplers += 1;

	return numSamplers;
}